

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  uint uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  element_type *peVar10;
  ulong *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  largeValue;
  bool zerovalid;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_ffffffffffffecc8;
  undefined2 in_stack_ffffffffffffeccc;
  undefined1 in_stack_ffffffffffffecce;
  undefined1 in_stack_ffffffffffffeccf;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffecd0;
  undefined4 in_stack_ffffffffffffecd8;
  undefined1 in_stack_ffffffffffffecdc;
  undefined1 in_stack_ffffffffffffecdd;
  undefined1 in_stack_ffffffffffffecde;
  undefined1 in_stack_ffffffffffffecdf;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffece0;
  undefined5 in_stack_ffffffffffffece8;
  undefined1 in_stack_ffffffffffffeced;
  undefined1 in_stack_ffffffffffffecee;
  undefined1 in_stack_ffffffffffffecef;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffecf0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed00;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed48;
  undefined7 in_stack_ffffffffffffed50;
  undefined1 in_stack_ffffffffffffed57;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffed58;
  bool local_129a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1298;
  bool local_11a2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10b0;
  undefined1 local_1078 [56];
  undefined1 local_1040 [56];
  undefined8 local_1008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1000;
  undefined1 local_fc8 [56];
  undefined8 local_f90 [8];
  undefined8 local_f50;
  undefined1 local_f48 [56];
  undefined1 local_f10 [112];
  undefined8 local_ea0;
  undefined1 local_e98 [56];
  undefined1 local_e60 [72];
  undefined1 local_e18 [56];
  undefined1 local_de0 [56];
  undefined1 local_da8 [56];
  undefined1 local_d70 [72];
  ulong local_d28;
  undefined1 local_d20 [56];
  undefined1 local_ce8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cb0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c78 [2];
  undefined4 local_c08;
  undefined4 local_bcc;
  undefined1 local_bb8 [56];
  undefined1 local_b80 [112];
  undefined4 local_b10;
  undefined4 local_ad4;
  ulong local_ac0;
  undefined1 local_ab4 [56];
  undefined1 local_a7c [171];
  byte local_9d1;
  undefined1 local_9c0 [56];
  undefined1 local_988 [72];
  ulong local_940;
  undefined1 local_934 [56];
  undefined1 local_8fc [56];
  undefined1 local_8c4 [56];
  uint local_88c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_888;
  undefined4 local_87c;
  undefined4 local_878;
  int local_874;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_870;
  undefined8 local_838;
  undefined1 local_830 [72];
  undefined1 local_7e8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  undefined8 local_778;
  undefined1 local_76c [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_734;
  byte local_6f9;
  undefined1 local_6f8 [56];
  undefined1 local_6c0 [56];
  undefined1 local_688 [56];
  undefined1 local_650 [216];
  cpp_dec_float<50U,_int,_void> *local_578;
  undefined8 local_568;
  undefined8 local_560;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined1 *local_540;
  undefined8 local_538;
  ulong *local_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined1 *local_510;
  undefined8 local_508;
  ulong *local_500;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined8 local_4d8;
  ulong *local_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  undefined1 *local_498;
  undefined8 local_490;
  undefined8 *local_488;
  undefined1 *local_480;
  undefined4 *local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  undefined4 *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  undefined1 *local_450;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  undefined1 *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  undefined1 *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  undefined1 *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined1 *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  undefined1 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  undefined1 *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  undefined1 *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined1 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined1 *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  undefined1 *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  undefined1 *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  undefined1 *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  undefined1 *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined4 *local_298;
  undefined4 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  ulong *local_270;
  undefined8 local_268;
  ulong *local_260;
  undefined8 local_258;
  ulong *local_250;
  undefined8 local_248;
  undefined8 local_240;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_231;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  undefined1 *local_1c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  undefined8 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined8 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  undefined8 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_578 = in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3e2794);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3e27b0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e27dc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e2808);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e2834);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e2860);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffece0,
               CONCAT13(in_stack_ffffffffffffecdf,
                        CONCAT12(in_stack_ffffffffffffecde,
                                 CONCAT11(in_stack_ffffffffffffecdd,in_stack_ffffffffffffecdc))));
  pnVar12 = &(in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_objoffset;
  local_450 = local_650;
  local_458 = pnVar12;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffeccf,
                      CONCAT16(in_stack_ffffffffffffecce,
                               CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  local_440 = local_688;
  local_448 = pnVar12;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffeccf,
                      CONCAT16(in_stack_ffffffffffffecce,
                               CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  local_430 = local_6c0;
  local_438 = pnVar12;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffeccf,
                      CONCAT16(in_stack_ffffffffffffecce,
                               CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  local_420 = local_6f8;
  local_428 = pnVar12;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffeccf,
                      CONCAT16(in_stack_ffffffffffffecce,
                               CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  local_6f9 = 1;
  local_560 = infinity();
  local_558 = &local_734;
  local_568 = 0;
  local_240 = local_560;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffece0,
             (double)CONCAT17(in_stack_ffffffffffffecdf,
                              CONCAT16(in_stack_ffffffffffffecde,
                                       CONCAT15(in_stack_ffffffffffffecdd,
                                                CONCAT14(in_stack_ffffffffffffecdc,
                                                         in_stack_ffffffffffffecd8)))),
             in_stack_ffffffffffffecd0);
  local_778 = 0x3ff0000000000000;
  feastol(in_stack_ffffffffffffed08);
  local_30 = &local_778;
  local_38 = &local_7b0;
  local_28 = local_76c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_38);
  local_20 = local_76c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
  local_8 = local_30;
  local_18 = local_38;
  local_10 = local_76c;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
             (double *)
             CONCAT17(in_stack_ffffffffffffeccf,
                      CONCAT16(in_stack_ffffffffffffecce,
                               CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))),
             (cpp_dec_float<50U,_int,_void> *)0x3e2aa1);
  local_548 = infinity();
  local_540 = local_7e8;
  local_550 = 0;
  local_248 = local_548;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffece0,
             (double)CONCAT17(in_stack_ffffffffffffecdf,
                              CONCAT16(in_stack_ffffffffffffecde,
                                       CONCAT15(in_stack_ffffffffffffecdd,
                                                CONCAT14(in_stack_ffffffffffffecdc,
                                                         in_stack_ffffffffffffecd8)))),
             in_stack_ffffffffffffecd0);
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffeccf,
                           CONCAT16(in_stack_ffffffffffffecce,
                                    CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))))
  ;
  peVar10 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x3e2b29);
  Tolerances::epsilon(peVar10);
  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (in_stack_ffffffffffffed10,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e2b70);
  if (bVar2) {
    local_838 = 0x3ff0000000000000;
    feastol(in_stack_ffffffffffffed08);
    local_70 = &local_838;
    local_78 = &local_870;
    local_68 = local_830;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_79,local_78);
    local_60 = local_830;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
    local_48 = local_70;
    local_58 = local_78;
    local_50 = local_830;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (double *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))),
               (cpp_dec_float<50U,_int,_void> *)0x3e2c60);
    local_330 = &local_734;
    local_338 = local_830;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  }
  local_874 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3e2d67);
  while (local_874 = local_874 + -1, -1 < local_874) {
    local_878 = 0;
    local_460 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_468 = &local_878;
    local_298 = local_468;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_87c = 0;
    local_470 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_478 = &local_87c;
    local_290 = local_478;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_888 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector(in_stack_ffffffffffffecd0,
                            CONCAT13(in_stack_ffffffffffffeccf,
                                     CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)))
    ;
    for (local_88c = 0; uVar1 = local_88c,
        iVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_888), (int)uVar1 < iVar9; local_88c = local_88c + 1) {
      local_418 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_888,local_88c);
      local_410 = local_8c4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_888,(char *)(ulong)local_88c,__c);
      local_9d1 = 0;
      local_408 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffecd0,
                        CONCAT13(in_stack_ffffffffffffeccf,
                                 CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
      local_400 = local_8fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
      puVar11 = (ulong *)infinity();
      local_940 = *puVar11 ^ 0x8000000000000000;
      local_528 = local_934;
      local_530 = &local_940;
      local_538 = 0;
      local_250 = local_530;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffece0,
                 (double)CONCAT17(in_stack_ffffffffffffecdf,
                                  CONCAT16(in_stack_ffffffffffffecde,
                                           CONCAT15(in_stack_ffffffffffffecdd,
                                                    CONCAT14(in_stack_ffffffffffffecdc,
                                                             in_stack_ffffffffffffecd8)))),
                 in_stack_ffffffffffffecd0);
      SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_ffffffffffffeccf,
                               CONCAT16(in_stack_ffffffffffffecce,
                                        CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8
                                                ))));
      peVar10 = std::
                __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3e3019);
      Tolerances::epsilon(peVar10);
      bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (in_stack_ffffffffffffed10,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
      local_11a2 = false;
      if (bVar2) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_888,(char *)(ulong)local_88c,__c_00);
        local_3f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rhs(in_stack_ffffffffffffecd0,
                          CONCAT13(in_stack_ffffffffffffeccf,
                                   CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
        local_3f0 = local_988;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
        local_518 = infinity();
        local_510 = local_9c0;
        local_520 = 0;
        local_258 = local_518;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffece0,
                   (double)CONCAT17(in_stack_ffffffffffffecdf,
                                    CONCAT16(in_stack_ffffffffffffecde,
                                             CONCAT15(in_stack_ffffffffffffecdd,
                                                      CONCAT14(in_stack_ffffffffffffecdc,
                                                               in_stack_ffffffffffffecd8)))),
                   in_stack_ffffffffffffecd0);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffeccf,
                                 CONCAT16(in_stack_ffffffffffffecce,
                                          CONCAT24(in_stack_ffffffffffffeccc,
                                                   in_stack_ffffffffffffecc8))));
        local_9d1 = 1;
        peVar10 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3e316b);
        Tolerances::epsilon(peVar10);
        local_11a2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (in_stack_ffffffffffffed10,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
      }
      if ((local_9d1 & 1) != 0) {
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e31dc)
        ;
      }
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e31e9);
      if (local_11a2 == false) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_888,(char *)(ulong)local_88c,__c_01);
        local_3e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lhs(in_stack_ffffffffffffecd0,
                          CONCAT13(in_stack_ffffffffffffeccf,
                                   CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
        local_3e0 = local_a7c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
        puVar11 = (ulong *)infinity();
        local_ac0 = *puVar11 ^ 0x8000000000000000;
        local_4f8 = local_ab4;
        local_500 = &local_ac0;
        local_508 = 0;
        local_260 = local_500;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffece0,
                   (double)CONCAT17(in_stack_ffffffffffffecdf,
                                    CONCAT16(in_stack_ffffffffffffecde,
                                             CONCAT15(in_stack_ffffffffffffecdd,
                                                      CONCAT14(in_stack_ffffffffffffecdc,
                                                               in_stack_ffffffffffffecd8)))),
                   in_stack_ffffffffffffecd0);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffeccf,
                                 CONCAT16(in_stack_ffffffffffffecce,
                                          CONCAT24(in_stack_ffffffffffffeccc,
                                                   in_stack_ffffffffffffecc8))));
        peVar10 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3e33bb);
        Tolerances::epsilon(peVar10);
        bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_ffffffffffffed10,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e3402)
        ;
        if (bVar2) {
          local_ad4 = 0;
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffecdf,
                                         CONCAT16(in_stack_ffffffffffffecde,
                                                  CONCAT15(in_stack_ffffffffffffecdd,
                                                           CONCAT14(in_stack_ffffffffffffecdc,
                                                                    in_stack_ffffffffffffecd8)))),
                             (int *)in_stack_ffffffffffffecd0);
          if (tVar3) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffecd0,
                         CONCAT13(in_stack_ffffffffffffeccf,
                                  CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffecdf,
                                     CONCAT16(in_stack_ffffffffffffecde,
                                              CONCAT15(in_stack_ffffffffffffecdd,
                                                       CONCAT14(in_stack_ffffffffffffecdc,
                                                                in_stack_ffffffffffffecd8)))),
                         (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
          }
          else {
            local_b10 = 0;
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffecdf,
                                           CONCAT16(in_stack_ffffffffffffecde,
                                                    CONCAT15(in_stack_ffffffffffffecdd,
                                                             CONCAT14(in_stack_ffffffffffffecdc,
                                                                      in_stack_ffffffffffffecd8)))),
                               (int *)in_stack_ffffffffffffecd0);
            if (tVar3) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffecd0,
                           CONCAT13(in_stack_ffffffffffffeccf,
                                    CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffecdf,
                                       CONCAT16(in_stack_ffffffffffffecde,
                                                CONCAT15(in_stack_ffffffffffffecdd,
                                                         CONCAT14(in_stack_ffffffffffffecdc,
                                                                  in_stack_ffffffffffffecd8)))),
                           (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
            }
          }
        }
        else {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_888,(char *)(ulong)local_88c,__c_02);
          local_3d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::rhs(in_stack_ffffffffffffecd0,
                            CONCAT13(in_stack_ffffffffffffeccf,
                                     CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)))
          ;
          local_3d0 = local_b80;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffeccf,
                              CONCAT16(in_stack_ffffffffffffecce,
                                       CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)
                                      )));
          local_4e8 = infinity();
          local_4e0 = local_bb8;
          local_4f0 = 0;
          local_268 = local_4e8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffece0,
                     (double)CONCAT17(in_stack_ffffffffffffecdf,
                                      CONCAT16(in_stack_ffffffffffffecde,
                                               CONCAT15(in_stack_ffffffffffffecdd,
                                                        CONCAT14(in_stack_ffffffffffffecdc,
                                                                 in_stack_ffffffffffffecd8)))),
                     in_stack_ffffffffffffecd0);
          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_ffffffffffffeccf,
                                   CONCAT16(in_stack_ffffffffffffecce,
                                            CONCAT24(in_stack_ffffffffffffeccc,
                                                     in_stack_ffffffffffffecc8))));
          peVar10 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x3e35f8);
          Tolerances::epsilon(peVar10);
          bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_ffffffffffffed10,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x3e363f);
          if (bVar2) {
            local_bcc = 0;
            tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffecdf,
                                           CONCAT16(in_stack_ffffffffffffecde,
                                                    CONCAT15(in_stack_ffffffffffffecdd,
                                                             CONCAT14(in_stack_ffffffffffffecdc,
                                                                      in_stack_ffffffffffffecd8)))),
                               (int *)in_stack_ffffffffffffecd0);
            if (tVar3) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffecd0,
                           CONCAT13(in_stack_ffffffffffffeccf,
                                    CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffecdf,
                                       CONCAT16(in_stack_ffffffffffffecde,
                                                CONCAT15(in_stack_ffffffffffffecdd,
                                                         CONCAT14(in_stack_ffffffffffffecdc,
                                                                  in_stack_ffffffffffffecd8)))),
                           (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
            }
            else {
              local_c08 = 0;
              tVar3 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT17(in_stack_ffffffffffffecdf,
                                             CONCAT16(in_stack_ffffffffffffecde,
                                                      CONCAT15(in_stack_ffffffffffffecdd,
                                                               CONCAT14(in_stack_ffffffffffffecdc,
                                                                        in_stack_ffffffffffffecd8)))
                                            ),(int *)in_stack_ffffffffffffecd0);
              if (tVar3) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffecdf,
                                         CONCAT16(in_stack_ffffffffffffecde,
                                                  CONCAT15(in_stack_ffffffffffffecdd,
                                                           CONCAT14(in_stack_ffffffffffffecdc,
                                                                    in_stack_ffffffffffffecd8)))),
                             (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
              }
            }
          }
        }
      }
      else {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffecd0,
                     CONCAT13(in_stack_ffffffffffffeccf,
                              CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffecdf,
                                 CONCAT16(in_stack_ffffffffffffecde,
                                          CONCAT15(in_stack_ffffffffffffecdd,
                                                   CONCAT14(in_stack_ffffffffffffecdc,
                                                            in_stack_ffffffffffffecd8)))),
                     (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffecd0,
                     CONCAT13(in_stack_ffffffffffffeccf,
                              CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffecdf,
                                 CONCAT16(in_stack_ffffffffffffecde,
                                          CONCAT15(in_stack_ffffffffffffecdd,
                                                   CONCAT14(in_stack_ffffffffffffecdc,
                                                            in_stack_ffffffffffffecd8)))),
                     (int)((ulong)in_stack_ffffffffffffecd0 >> 0x20));
      }
    }
    local_3c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_ffffffffffffecd0,
                        CONCAT13(in_stack_ffffffffffffeccf,
                                 CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    local_3c0 = local_c78;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_3b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper(in_stack_ffffffffffffecd0,
                        CONCAT13(in_stack_ffffffffffffeccf,
                                 CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    local_3b0 = &local_cb0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_3a0 = local_ce8;
    local_3a8 = local_c78;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    puVar11 = (ulong *)infinity();
    local_d28 = *puVar11 ^ 0x8000000000000000;
    local_4c8 = local_d20;
    local_4d0 = &local_d28;
    local_4d8 = 0;
    local_270 = local_4d0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffece0,
               (double)CONCAT17(in_stack_ffffffffffffecdf,
                                CONCAT16(in_stack_ffffffffffffecde,
                                         CONCAT15(in_stack_ffffffffffffecdd,
                                                  CONCAT14(in_stack_ffffffffffffecdc,
                                                           in_stack_ffffffffffffecd8)))),
               in_stack_ffffffffffffecd0);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffeccf,
                             CONCAT16(in_stack_ffffffffffffecce,
                                      CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))
                            ));
    peVar10 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3e38d7);
    Tolerances::epsilon(peVar10);
    bVar2 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffed10,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e391e);
    if (bVar2) {
      local_e8 = &local_734;
      local_e0 = local_da8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e8);
      local_d8 = local_e8;
      local_d0 = local_da8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
      local_c8 = local_da8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffeccf,
                                     CONCAT16(in_stack_ffffffffffffecce,
                                              CONCAT24(in_stack_ffffffffffffeccc,
                                                       in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e39d6);
      if (tVar3) {
        local_118 = &local_734;
        local_110 = local_d70;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_119,local_118);
        local_108 = local_118;
        local_100 = local_d70;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
        local_f8 = local_d70;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
      }
      else {
        local_390 = local_d70;
        local_398 = &local_cb0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
      }
      local_340 = local_c78;
      local_348 = local_d70;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    }
    local_380 = local_de0;
    local_388 = &local_cb0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_4b8 = infinity();
    local_4b0 = local_e18;
    local_4c0 = 0;
    local_278 = local_4b8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffece0,
               (double)CONCAT17(in_stack_ffffffffffffecdf,
                                CONCAT16(in_stack_ffffffffffffecde,
                                         CONCAT15(in_stack_ffffffffffffecdd,
                                                  CONCAT14(in_stack_ffffffffffffecdc,
                                                           in_stack_ffffffffffffecd8)))),
               in_stack_ffffffffffffecd0);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffeccf,
                             CONCAT16(in_stack_ffffffffffffecce,
                                      CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))
                            ));
    peVar10 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3e3bcf);
    Tolerances::epsilon(peVar10);
    bVar2 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffed10,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffed08,(double)in_stack_ffffffffffffed00);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3e3c16);
    if (bVar2) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower(in_stack_ffffffffffffecd0,
              CONCAT13(in_stack_ffffffffffffeccf,
                       CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffeccf,
                                     CONCAT16(in_stack_ffffffffffffecce,
                                              CONCAT24(in_stack_ffffffffffffeccc,
                                                       in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e3c59);
      if (tVar3) {
        local_1298 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lower(in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
      }
      else {
        local_1298 = &local_734;
      }
      local_2a0 = &local_cb0;
      local_2a8 = local_1298;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    }
    if ((local_6f9 & 1) != 0) {
      local_370 = local_e60;
      local_378 = local_c78;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
      local_ea0 = 0;
      local_498 = local_e98;
      local_4a0 = &local_ea0;
      local_4a8 = 0;
      local_280 = local_4a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffece0,
                 (double)CONCAT17(in_stack_ffffffffffffecdf,
                                  CONCAT16(in_stack_ffffffffffffecde,
                                           CONCAT15(in_stack_ffffffffffffecdd,
                                                    CONCAT14(in_stack_ffffffffffffecdc,
                                                             in_stack_ffffffffffffecd8)))),
                 in_stack_ffffffffffffecd0);
      feastol(in_stack_ffffffffffffed08);
      bVar2 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffed10,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
      local_129a = false;
      if (bVar2) {
        local_360 = local_f10;
        local_368 = &local_cb0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
        local_f50 = 0;
        local_480 = local_f48;
        local_488 = &local_f50;
        local_490 = 0;
        local_288 = local_488;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffece0,
                   (double)CONCAT17(in_stack_ffffffffffffecdf,
                                    CONCAT16(in_stack_ffffffffffffecde,
                                             CONCAT15(in_stack_ffffffffffffecdd,
                                                      CONCAT14(in_stack_ffffffffffffecdc,
                                                               in_stack_ffffffffffffecd8)))),
                   in_stack_ffffffffffffecd0);
        feastol(in_stack_ffffffffffffed08);
        local_129a = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50),
                                in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
      }
      if (local_129a == false) {
        local_6f9 = 0;
      }
      else {
        local_f90[0] = 0;
        local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffecd0,
                                 CONCAT13(in_stack_ffffffffffffeccf,
                                          CONCAT12(in_stack_ffffffffffffecce,
                                                   in_stack_ffffffffffffeccc)));
        local_178 = local_f90;
        local_168 = local_178;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_ffffffffffffed58,
                   (double)CONCAT17(in_stack_ffffffffffffed57,in_stack_ffffffffffffed50));
      }
    }
    local_2b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_2b8 = local_c78;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    local_2c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_2c8 = &local_cb0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    in_stack_ffffffffffffed58 =
         &VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffecd0,
                       CONCAT13(in_stack_ffffffffffffeccf,
                                CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)))->
          m_backend;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffecd0,
                 CONCAT13(in_stack_ffffffffffffeccf,
                          CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_ffffffffffffeccf,
                                   CONCAT16(in_stack_ffffffffffffecce,
                                            CONCAT24(in_stack_ffffffffffffeccc,
                                                     in_stack_ffffffffffffecc8))),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3e403c);
    if (tVar3) {
      local_2d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffecd0,
                               CONCAT13(in_stack_ffffffffffffeccf,
                                        CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc
                                                )));
      local_2d8 = &local_cb0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffeccf,
                          CONCAT16(in_stack_ffffffffffffecce,
                                   CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
    }
    else {
      in_stack_ffffffffffffed48 =
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffecd0,
                        CONCAT13(in_stack_ffffffffffffeccf,
                                 CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffecd0,
                   CONCAT13(in_stack_ffffffffffffeccf,
                            CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
      in_stack_ffffffffffffed57 =
           boost::multiprecision::operator<
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT17(in_stack_ffffffffffffeccf,
                                  CONCAT16(in_stack_ffffffffffffecce,
                                           CONCAT24(in_stack_ffffffffffffeccc,
                                                    in_stack_ffffffffffffecc8))),
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)0x3e40d8);
      if ((bool)in_stack_ffffffffffffed57) {
        local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffecd0,
                                 CONCAT13(in_stack_ffffffffffffeccf,
                                          CONCAT12(in_stack_ffffffffffffecce,
                                                   in_stack_ffffffffffffeccc)));
        local_2e8 = local_c78;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
      }
      else {
        in_stack_ffffffffffffed40 = &local_1000;
        local_150 = local_c78;
        local_158 = &local_cb0;
        local_148 = in_stack_ffffffffffffed40;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_159,local_150,local_158);
        local_140 = in_stack_ffffffffffffed40;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
        local_130 = local_150;
        local_138 = local_158;
        local_128 = in_stack_ffffffffffffed40;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                   ,(cpp_dec_float<50U,_int,_void> *)0x3e41ea);
        local_1008 = 0x4000000000000000;
        local_b0 = &local_1000;
        local_b8 = &local_1008;
        local_a8 = local_fc8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b0);
        local_a0 = local_fc8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
        local_98 = local_b0;
        local_88 = local_b8;
        local_90 = local_fc8;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                   ,(double *)0x3e42ae);
        local_350 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffecd0,
                                 CONCAT13(in_stack_ffffffffffffeccf,
                                          CONCAT12(in_stack_ffffffffffffecce,
                                                   in_stack_ffffffffffffeccc)));
        local_358 = local_fc8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffeccf,
                            CONCAT16(in_stack_ffffffffffffecce,
                                     CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8)))
                  );
      }
    }
    pnVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj(in_stack_ffffffffffffecd0,
                       CONCAT13(in_stack_ffffffffffffeccf,
                                CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    local_1b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_1a8 = pnVar12;
    local_1a0 = local_1040;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1b1,pnVar12,local_1b0);
    local_198 = local_1040;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
    local_188 = local_1a8;
    local_190 = local_1b0;
    local_180 = local_1040;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))),
               (cpp_dec_float<50U,_int,_void> *)0x3e43cd);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffecf0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffecef,
                          CONCAT16(in_stack_ffffffffffffecee,
                                   CONCAT15(in_stack_ffffffffffffeced,in_stack_ffffffffffffece8))));
    pnVar12 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj(in_stack_ffffffffffffecd0,
                       CONCAT13(in_stack_ffffffffffffeccf,
                                CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    local_1f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    local_1e8 = pnVar12;
    local_1e0 = local_1078;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1f1,pnVar12,local_1f0);
    local_1d8 = local_1078;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
    local_1c8 = local_1e8;
    local_1d0 = local_1f0;
    local_1c0 = local_1078;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))),
               (cpp_dec_float<50U,_int,_void> *)0x3e44c0);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffecf0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffecef,
                          CONCAT16(in_stack_ffffffffffffecee,
                                   CONCAT15(in_stack_ffffffffffffeced,in_stack_ffffffffffffece8))));
    in_stack_ffffffffffffed08 =
         (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxObj(in_stack_ffffffffffffecd0,
                     CONCAT13(in_stack_ffffffffffffeccf,
                              CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc)));
    local_230 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffecd0,
                             CONCAT13(in_stack_ffffffffffffeccf,
                                      CONCAT12(in_stack_ffffffffffffecce,in_stack_ffffffffffffeccc))
                            );
    in_stack_ffffffffffffed10 = &local_10b0;
    local_228 = in_stack_ffffffffffffed08;
    local_220 = in_stack_ffffffffffffed10;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_231,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffed08,local_230);
    local_218 = in_stack_ffffffffffffed10;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0);
    local_208 = local_228;
    local_210 = local_230;
    local_200 = in_stack_ffffffffffffed10;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))),
               (cpp_dec_float<50U,_int,_void> *)0x3e45b3);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffecf0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffecef,
                          CONCAT16(in_stack_ffffffffffffecee,
                                   CONCAT15(in_stack_ffffffffffffeced,in_stack_ffffffffffffece8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffecd0,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffeccf,
                           CONCAT16(in_stack_ffffffffffffecce,
                                    CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))))
  ;
  bVar2 = checkSolution(in_RDI,(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(iVar5,iVar6),
                        (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(iVar7,iVar8));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4637);
  if ((bVar2) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffeccf,
                                     CONCAT16(in_stack_ffffffffffffecce,
                                              CONCAT24(in_stack_ffffffffffffeccc,
                                                       in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e4660), tVar3)) {
    local_2f0 = &in_RDI->m_cutoffbound;
    local_2f8 = local_688;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffecd0,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffeccf,
                           CONCAT16(in_stack_ffffffffffffecce,
                                    CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))))
  ;
  bVar4 = checkSolution(in_RDI,(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(iVar5,iVar6),
                        (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(iVar7,iVar8));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4726);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffeccf,
                                     CONCAT16(in_stack_ffffffffffffecce,
                                              CONCAT24(in_stack_ffffffffffffeccc,
                                                       in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e474f), tVar3)) {
    local_300 = &in_RDI->m_cutoffbound;
    local_308 = local_6c0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  }
  bVar4 = 0;
  if ((local_6f9 & 1) != 0) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffecd0,
                 (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffeccf,
                             CONCAT16(in_stack_ffffffffffffecce,
                                      CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))
                            ));
    bVar4 = checkSolution(in_RDI,(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(iVar5,iVar6),
                          (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(iVar7,iVar8));
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3e4855);
  }
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffeccf,
                                     CONCAT16(in_stack_ffffffffffffecce,
                                              CONCAT24(in_stack_ffffffffffffeccc,
                                                       in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e487e), tVar3)) {
    local_310 = &in_RDI->m_cutoffbound;
    local_318 = local_650;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffecd0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffeccf,
                        CONCAT16(in_stack_ffffffffffffecce,
                                 CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_578,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffeccf,
                           CONCAT16(in_stack_ffffffffffffecce,
                                    CONCAT24(in_stack_ffffffffffffeccc,in_stack_ffffffffffffecc8))))
  ;
  bVar4 = checkSolution(in_RDI,(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(iVar5,iVar6),
                        (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(iVar7,iVar8));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4950);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffecce,
                                                    CONCAT24(in_stack_ffffffffffffeccc,
                                                             in_stack_ffffffffffffecc8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3e4979), tVar3)) {
    local_320 = &in_RDI->m_cutoffbound;
    local_328 = local_6f8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (local_578,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT17(bVar4,CONCAT16(tVar3,CONCAT24(in_stack_ffffffffffffeccc,
                                                      in_stack_ffffffffffffecc8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e49f8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4a05);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4a12);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4a1f);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4a2c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x3e4a39);
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}